

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O3

void helicsFilterAddDeliveryEndpoint(HelicsFilter filt,char *delivery,HelicsError *err)

{
  CloningFilter *this;
  size_t sVar1;
  string_view endpoint;
  
  this = anon_unknown.dwarf_ba607::getCloningFilter(filt,err);
  if (this != (CloningFilter *)0x0) {
    if (delivery == (char *)0x0) {
      if (err != (HelicsError *)0x0) {
        err->error_code = -4;
        err->message = "The supplied string argument is null and therefore invalid";
      }
    }
    else {
      sVar1 = strlen(delivery);
      endpoint._M_str = delivery;
      endpoint._M_len = sVar1;
      helics::CloningFilter::addDeliveryEndpoint(this,endpoint);
    }
  }
  return;
}

Assistant:

void helicsFilterAddDeliveryEndpoint(HelicsFilter filt, const char* delivery, HelicsError* err)
{
    auto* filter = getCloningFilter(filt, err);
    if (filter == nullptr) {
        return;
    }
    CHECK_NULL_STRING(delivery, void());
    try {
        filter->addDeliveryEndpoint(delivery);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}